

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func_queue_examples.cpp
# Opt level: O1

void density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples
               (ostream *i_ostream)

{
  char cVar1;
  bool bVar2;
  ostream *poVar3;
  void *pvVar4;
  long lVar5;
  undefined8 *puVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
  queue;
  type return_value;
  anon_class_8_1_90f47376 func;
  double last_val;
  PrintScopeDuration dur;
  put_transaction<Func> local_b8;
  put_transaction<typename_std::decay<Func>::type> local_a0;
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  local_88;
  put_transaction<Func> local_78;
  PrintScopeDuration local_60;
  
  PrintScopeDuration::PrintScopeDuration(&local_60,i_ostream,"function queue put samples");
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_b8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_1_,density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_1_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_a0);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_2_,density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_2_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_a0);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_3_,density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_3_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_a0);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_4_,density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_4_>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(anon_class_1_0_00000001 *)&local_a0);
  do {
    bVar2 = density::
            function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
            ::try_consume_impl((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                                *)&local_b8);
  } while (bVar2);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             *)&local_b8);
  local_88.m_head = (ControlBlock *)&local_78;
  local_78.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x3ff0000000000000;
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_b8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  iVar9 = 10;
  do {
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>>
    ::
    emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_5_,density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::_lambda()_5_&>
              ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,double()>,density::basic_default_allocator<65536ul>>
                *)&local_b8,(anon_class_8_1_90f47376 *)&local_88);
    iVar9 = iVar9 + -1;
  } while (iVar9 != 0);
  do {
    density::
    function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
    ::try_consume_impl((function_queue<double_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                        *)&local_a0,&local_b8);
    cVar1 = (char)local_a0.m_put_data.m_control_block;
    if ((char)local_a0.m_put_data.m_control_block == '\0') break;
    poVar3 = std::ostream::_M_insert<double>((double)local_a0.m_queue);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
  } while (cVar1 != '\0');
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_double_()>,_density::basic_default_allocator<65536UL>_>
             *)&local_b8);
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_b8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)func_queue_put_samples::Struct::func_1;
  local_a0.m_put_data.m_control_block = (ControlBlock *)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(offset_in_Struct_to_subr *)&local_a0);
  local_a0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)func_queue_put_samples::Struct::func_2;
  local_a0.m_put_data.m_control_block = (ControlBlock *)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)(),int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*)()>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(offset_in_Struct_to_subr *)&local_a0);
  local_a0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int_density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(offset_in_Struct_to_int *)&local_a0);
  local_a0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x4;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
  ::
  emplace<int_density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*,int_density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct::*>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,int(density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Struct*)>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(offset_in_Struct_to_int *)&local_a0);
  local_a0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x400000003;
  iVar9 = 0;
  do {
    density::
    function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
    ::try_consume_impl((function_queue<int_(Struct_*),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                        *)&local_78,&local_b8,&local_a0);
    iVar8 = 0;
    if (local_78.m_queue._4_1_ != '\0') {
      iVar8 = (int)local_78.m_queue;
    }
    iVar9 = iVar9 + iVar8;
  } while (local_78.m_queue._4_1_ != '\0');
  if (iVar9 != 10) {
    __assert_fail("sum == 10",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0x5c,
                  "static void density_tests::FunctionQueueSamples<density::function_standard_erasure>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                 );
  }
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_int_(Struct_*)>,_density::basic_default_allocator<65536UL>_>
             *)&local_b8);
  local_b8.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_b8.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_a0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)CONCAT44(local_a0.m_queue._4_4_,7);
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
  ::
  emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func,int>
            ((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
              *)&local_b8,(int *)&local_a0);
  bVar2 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
          ::try_consume_impl((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                              *)&local_b8);
  if (!bVar2) {
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0x7e,
                  "static void density_tests::FunctionQueueSamples<density::function_standard_erasure>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                 );
  }
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::destroy((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             *)&local_b8);
  local_78.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)&DAT_0000ffef;
  local_78.m_put_data.m_control_block = (ControlBlock *)&DAT_0000ffef;
  local_88.m_head = (ControlBlock *)0x0;
  local_88.m_tail = (ControlBlock *)0x0;
  density::
  function_queue<void(),density::basic_default_allocator<65536ul>,(density::function_type_erasure)0>
  ::
  start_push<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
            (&local_a0,&local_78,(Func_conflict *)&local_88);
  local_b8.m_queue = local_a0.m_queue;
  local_b8.m_put_data.m_control_block = local_a0.m_put_data.m_control_block;
  local_b8.m_put_data.m_user_storage = local_a0.m_put_data.m_user_storage;
  local_a0.m_queue =
       (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
        *)0x0;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::~put_transaction(&local_a0);
  pvVar4 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate(&local_b8,0xc,1);
  lVar5 = 0;
  do {
    *(char *)((long)pvVar4 + lVar5) = "Hello world"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0xc);
  puVar6 = (undefined8 *)
           density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element_ptr(&local_b8);
  *puVar6 = pvVar4;
  pvVar4 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::raw_allocate(&local_b8,0x12,1);
  lVar5 = 0;
  do {
    *(char *)((long)pvVar4 + lVar5) = "\t(I\'m so happy)!!"[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x12);
  pvVar7 = density::
           heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
           ::put_transaction<Func>::element_ptr(&local_b8);
  *(void **)((long)pvVar7 + 8) = pvVar4;
  density::
  heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
  ::put_transaction<Func>::commit(&local_b8);
  bVar2 = density::
          function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
          ::try_consume_impl((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                              *)&local_78);
  if (bVar2) {
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::put_transaction<Func>::~put_transaction(&local_b8);
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::destroy((heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
               *)&local_78);
    local_88.m_head = (ControlBlock *)&DAT_0000ffef;
    local_88.m_tail = (ControlBlock *)&DAT_0000ffef;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
    ::
    start_emplace<density_tests::FunctionQueueSamples<(density::function_type_erasure)0>::func_queue_put_samples(std::ostream&)::Func>
              (&local_b8,
               (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,void()>,density::basic_default_allocator<65536ul>>
                *)&local_88);
    local_78.m_queue = local_b8.m_queue;
    local_78.m_put_data.m_control_block = local_b8.m_put_data.m_control_block;
    local_78.m_put_data.m_user_storage = local_b8.m_put_data.m_user_storage;
    local_b8.m_queue =
         (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::put_transaction<Func>::~put_transaction(&local_b8);
    local_a0.m_queue = local_78.m_queue;
    local_a0.m_put_data.m_control_block = local_78.m_put_data.m_control_block;
    local_a0.m_put_data.m_user_storage = local_78.m_put_data.m_user_storage;
    local_78.m_queue =
         (heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
          *)0x0;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::put_transaction<Func>::~put_transaction(&local_78);
    pvVar4 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::raw_allocate(&local_a0,0xc,1);
    lVar5 = 0;
    do {
      *(char *)((long)pvVar4 + lVar5) = "Hello world"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xc);
    puVar6 = (undefined8 *)
             density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::element_ptr(&local_a0);
    *puVar6 = pvVar4;
    pvVar4 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::raw_allocate(&local_a0,0x12,1);
    lVar5 = 0;
    do {
      *(char *)((long)pvVar4 + lVar5) = "\t(I\'m so happy)!!"[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x12);
    pvVar7 = density::
             heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
             ::put_transaction<Func>::element_ptr(&local_a0);
    *(void **)((long)pvVar7 + 8) = pvVar4;
    density::
    heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
    ::put_transaction<Func>::commit(&local_a0);
    bVar2 = density::
            function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
            ::try_consume_impl((function_queue<void_(),_density::basic_default_allocator<65536UL>,_(density::function_type_erasure)0>
                                *)&local_88);
    if (bVar2) {
      density::
      heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::put_transaction<Func>::~put_transaction(&local_a0);
      density::
      heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)0,_void_()>,_density::basic_default_allocator<65536UL>_>
      ::destroy(&local_88);
      PrintScopeDuration::~PrintScopeDuration(&local_60);
      return;
    }
    __assert_fail("invoked",
                  "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                  ,0xb8,
                  "static void density_tests::FunctionQueueSamples<density::function_standard_erasure>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
                 );
  }
  __assert_fail("invoked",
                "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/examples/func_queue_examples.cpp"
                ,0x9b,
                "static void density_tests::FunctionQueueSamples<density::function_standard_erasure>::func_queue_put_samples(std::ostream &) [ERASURE = density::function_standard_erasure]"
               );
}

Assistant:

static void func_queue_put_samples(std::ostream & i_ostream)
        {
            PrintScopeDuration dur(i_ostream, "function queue put samples");

            using namespace density;

            {
                //! [function_queue push example 1]
                function_queue<void(), default_allocator, ERASURE> queue;
                queue.push([] { std::cout << "Hello"; });
                queue.push([] { std::cout << " world"; });
                queue.push([] { std::cout << "!!!"; });
                queue.push([] { std::cout << std::endl; });
                while (queue.try_consume())
                    ;
                //! [function_queue push example 1]
            }
            {
                //! [function_queue push example 2]
                double last_val = 1.;

                auto func = [&last_val] { return last_val /= 2.; };

                function_queue<double(), default_allocator, ERASURE> queue;
                for (int i = 0; i < 10; i++)
                    queue.push(func);

                while (auto const return_value = queue.try_consume())
                    std::cout << *return_value << std::endl;
                //! [function_queue push example 2]
            }
            {
                //! [function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64) /* the size of a type must always be a multiple of
        the alignment, but in the microsoft's compiler, on 64-bit targets, pointers to data
        member are 4 bytes big, but are aligned to 8 bytes.

        Test code:
            using T = int Struct::*;
            std::cout << sizeof(T) << std::endl;
            std::cout << alignof(T) << std::endl;
        */

                struct Struct
                {
                    int func_1() { return 1; }
                    int func_2() { return 2; }
                    int var_1 = 3;
                    int var_2 = 4;
                };

                function_queue<int(Struct *)> queue;
                queue.push(&Struct::func_1);
                queue.push(&Struct::func_2);
                queue.push(&Struct::var_1);
                queue.push(&Struct::var_2);

                Struct struct_instance;

                int sum = 0;
                while (auto const return_value = queue.try_consume(&struct_instance))
                    sum += *return_value;
                assert(sum == 10);

#endif
//! [function_queue push example 3]
#if !defined(_MSC_VER) || !defined(_M_X64)
                (void)sum;
#endif
            }
            {
                //! [function_queue emplace example 1]
                /* This local struct is unmovable and uncopyable, so emplace is the only
                    option to add it to the queue. Note that operator () returns an int,
                    but we add it to a void() function queue. This is ok, as we are just
                    discarding the return value. */
                struct Func
                {
                    int const m_value;

                    Func(int i_value) : m_value(i_value) {}

                    Func(const Func &) = delete;
                    Func & operator=(const Func &) = delete;

                    int operator()() const
                    {
                        std::cout << m_value << std::endl;
                        return m_value;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;
                queue.template emplace<Func>(7);

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [function_queue emplace example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_push example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.start_push(Func{});

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [function_queue start_push example 1]
                (void)invoked;
            }
            {
                //! [function_queue start_emplace example 1]
                struct Func
                {
                    const char * m_string_1;
                    const char * m_string_2;

                    void operator()()
                    {
                        std::cout << m_string_1 << std::endl;
                        std::cout << m_string_2 << std::endl;
                    }
                };

                function_queue<void(), default_allocator, ERASURE> queue;
                auto transaction = queue.template start_emplace<Func>();

                // in case of exception here, since the transaction is not committed, it is discarded with no observable effects
                transaction.element().m_string_1 = transaction.raw_allocate_copy("Hello world");
                transaction.element().m_string_2 =
                  transaction.raw_allocate_copy("\t(I'm so happy)!!");

                transaction.commit();

                bool const invoked = queue.try_consume();
                assert(invoked);
                //! [function_queue start_emplace example 1]
                (void)invoked;
            }
        }